

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
wabt::Opcode::GetBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Opcode *this)

{
  bool bVar1;
  uint32_t uVar2;
  value_type_conflict local_41 [9];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  const_iterator local_30;
  Offset local_28;
  Offset length;
  uint8_t buffer [5];
  Opcode *pOStack_18;
  Opcode *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  length._7_1_ = 0;
  pOStack_18 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  bVar1 = HasPrefix(this);
  if (bVar1) {
    length._6_1_ = GetPrefix(this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,(value_type_conflict *)((long)&length + 6));
    uVar2 = GetCode(this);
    local_28 = WriteU32Leb128Raw((uint8_t *)((long)&length + 1),(uint8_t *)((long)&length + 6),uVar2
                                );
    if (local_28 == 0) {
      __assert_fail("length != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/opcode.cc"
                    ,0x1a7,"std::vector<uint8_t> wabt::Opcode::GetBytes() const");
    }
    local_38._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_30,&local_38);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               local_30,(uchar *)((long)&length + 1),(uchar *)((long)&length + local_28 + 1));
  }
  else {
    uVar2 = GetCode(this);
    local_41[0] = (value_type_conflict)uVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Opcode::GetBytes() const {
  std::vector<uint8_t> result;
  if (HasPrefix()) {
    result.push_back(GetPrefix());
    uint8_t buffer[5];
    Offset length =
        WriteU32Leb128Raw(buffer, buffer + sizeof(buffer), GetCode());
    assert(length != 0);
    result.insert(result.end(), buffer, buffer + length);
  } else {
    result.push_back(GetCode());
  }
  return result;
}